

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_file_descriptor.c
# Opt level: O1

file_descriptor file_descriptor_create(directory_descriptor owner,char *name)

{
  file_descriptor pfVar1;
  
  pfVar1 = (file_descriptor)malloc(0x120);
  if (pfVar1 == (file_descriptor)0x0) {
    pfVar1 = (file_descriptor)0x0;
  }
  else {
    pfVar1->owner = owner;
  }
  return pfVar1;
}

Assistant:

file_descriptor file_descriptor_create(directory_descriptor owner, const char *name)
{
	file_descriptor f = malloc(sizeof(struct file_descriptor_type));

	if (f != NULL)
	{
		f->owner = owner;

		/* TODO: extract name & extension */

		(void)name;

		return f;
	}

	return NULL;
}